

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  char cVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  float *pfVar8;
  char *pcVar9;
  char *pcVar10;
  float scale;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  float fVar17;
  uint c;
  uint local_70;
  float local_6c;
  float local_68;
  float fStack_64;
  uint uStack_60;
  float fStack_5c;
  float local_58;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  char **local_40;
  ImFont *local_38;
  
  local_6c = max_width;
  local_40 = remaining;
  if (text_end == (char *)0x0) {
    sVar6 = strlen(text_begin);
    text_end = text_begin + sVar6;
  }
  scale = size / this->FontSize;
  fVar14 = 0.0;
  fVar15 = 0.0;
  uVar16 = 0;
  fVar17 = 0.0;
  local_38 = this;
LAB_00136c83:
  pcVar7 = (char *)0x0;
  pcVar9 = text_begin;
LAB_00136c85:
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  fVar12 = fVar15;
  fVar11 = 0.0;
  fVar2 = fVar14;
  uVar3 = uVar16;
  fVar4 = fVar17;
LAB_00136c90:
  fStack_5c = fVar4;
  uStack_60 = uVar3;
  fStack_64 = fVar15;
  local_68 = fVar2;
  local_58 = fVar11;
  text_begin = pcVar9;
  pcVar10 = text_begin;
  if (text_end <= text_begin) goto LAB_00136e09;
  if (0.0 < wrap_width) {
    if (pcVar7 == (char *)0x0) {
      pcVar7 = CalcWordWrapPositionA(local_38,scale,text_begin,text_end,wrap_width - local_58);
      pcVar7 = pcVar7 + (pcVar7 == text_begin);
      fVar14 = local_68;
      fVar12 = fStack_64;
      uVar16 = uStack_60;
      fVar17 = fStack_5c;
    }
    if (pcVar7 <= text_begin) {
      if (fVar14 < local_58) {
        fVar14 = local_58;
      }
      fVar15 = fVar12 + size;
      goto LAB_00136dd1;
    }
  }
  local_70 = (uint)*text_begin;
  if (*text_begin < '\0') {
    iVar5 = ImTextCharFromUtf8(&local_70,text_begin,text_end);
    pcVar9 = text_begin + iVar5;
    pcVar10 = pcVar9;
    fVar14 = local_68;
    fVar12 = fStack_64;
    uVar16 = uStack_60;
    fVar17 = fStack_5c;
    if (local_70 == 0) goto LAB_00136e09;
  }
  else {
    pcVar9 = text_begin + 1;
  }
  if (local_70 < 0x20) goto code_r0x00136d3a;
  goto LAB_00136d44;
LAB_00136dd1:
  if (text_end <= text_begin) goto LAB_00136c83;
  cVar1 = *text_begin;
  if ((cVar1 != '\t') && (cVar1 != ' ')) {
    text_begin = text_begin + (cVar1 == '\n');
    goto LAB_00136c83;
  }
  text_begin = text_begin + 1;
  goto LAB_00136dd1;
code_r0x00136d3a:
  fVar11 = local_58;
  fVar2 = fVar14;
  fVar15 = fVar12;
  uVar3 = uVar16;
  fVar4 = fVar17;
  if (local_70 == 0xd) goto LAB_00136c90;
  if (local_70 != 10) {
LAB_00136d44:
    pfVar8 = &this->FallbackXAdvance;
    if ((int)local_70 < (this->IndexXAdvance).Size) {
      pfVar8 = ImVector<float>::operator[](&this->IndexXAdvance,local_70);
      fVar14 = local_68;
      fVar12 = fStack_64;
      uVar16 = uStack_60;
      fVar17 = fStack_5c;
    }
    fVar11 = *pfVar8 * scale + local_58;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    pcVar10 = text_begin;
    fVar2 = local_68;
    fVar15 = fStack_64;
    uVar3 = uStack_60;
    fVar4 = fStack_5c;
    if (local_6c <= fVar11) {
LAB_00136e09:
      if (local_40 != (char **)0x0) {
        *local_40 = pcVar10;
      }
      if (fVar14 < local_58) {
        fVar14 = local_58;
      }
      if (fVar12 == 0.0 || 0.0 < local_58) {
        fVar12 = fVar12 + size;
      }
      IVar13.y = fVar12;
      IVar13.x = fVar14;
      return IVar13;
    }
    goto LAB_00136c90;
  }
  uVar16 = uStack_54 & (uint)fVar12;
  fVar14 = (float)(~-(uint)(local_58 <= fVar14) & (uint)local_58 |
                  -(uint)(local_58 <= fVar14) & (uint)fVar14);
  fVar15 = fVar12 + size;
  fVar17 = fVar12;
  goto LAB_00136c85;
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0,0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsSpace(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0)
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexXAdvance.Size ? IndexXAdvance[(int)c] : FallbackXAdvance) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}